

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O0

Literals * __thiscall
wasm::ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>::callFunctionInternal
          (Literals *__return_storage_ptr__,
          ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *this,Name name,
          Literals *arguments)

{
  size_t sVar1;
  bool bVar2;
  byte bVar3;
  size_type sVar4;
  Function *function_00;
  EvallingModuleRunner *parent;
  ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner> *this_00;
  Type TVar5;
  Type TVar6;
  ostream *poVar7;
  size_type sVar8;
  char *pcVar9;
  Name name_00;
  Name NVar10;
  bool local_15a;
  Type type;
  undefined1 local_e0 [8];
  Flow flow;
  FunctionScope scope;
  Function *function;
  size_type previousFunctionStackSize;
  size_t previousCallDepth;
  Literals *arguments_local;
  ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *this_local;
  Name name_local;
  
  name_local.super_IString.str._M_len = name.super_IString.str._M_str;
  this_local = name.super_IString.str._M_len;
  name_local.super_IString.str._M_str = (char *)__return_storage_ptr__;
  if (0xfa < this->callDepth) {
    (*this->externalInterface->_vptr_ExternalInterface[8])(this->externalInterface,"stack limit");
  }
  sVar1 = this->callDepth;
  this->callDepth = this->callDepth + 1;
  sVar4 = std::vector<wasm::Name,_std::allocator<wasm::Name>_>::size(&this->functionStack);
  std::vector<wasm::Name,_std::allocator<wasm::Name>_>::push_back
            (&this->functionStack,(value_type *)&this_local);
  NVar10.super_IString.str._M_str = (char *)this_local;
  NVar10.super_IString.str._M_len = (size_t)this->wasm;
  function_00 = (Function *)::wasm::Module::getFunction(NVar10);
  if (function_00 == (Function *)0x0) {
    __assert_fail("function",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-interpreter.h"
                  ,0xef9,
                  "Literals wasm::ModuleRunnerBase<(anonymous namespace)::EvallingModuleRunner>::callFunctionInternal(Name, const Literals &) [SubType = (anonymous namespace)::EvallingModuleRunner]"
                 );
  }
  parent = self(this);
  FunctionScope::FunctionScope
            ((FunctionScope *)&flow.breakTo.super_IString.str._M_str,function_00,arguments,parent);
  this_00 = (ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner> *)self(this);
  ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::visit
            ((Flow *)local_e0,this_00,function_00->body);
  bVar2 = Flow::breaking((Flow *)local_e0);
  pcVar9 = (char *)CONCAT71((int7)((ulong)parent >> 8),bVar2);
  local_15a = true;
  if (bVar2) {
    local_15a = IString::operator==((IString *)
                                    &flow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                                     super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                    (IString *)&RETURN_FLOW);
  }
  if (local_15a != false) {
    TVar5 = Flow::getType((Flow *)local_e0);
    TVar6 = Function::getResults(function_00);
    bVar3 = ::wasm::Type::isSubType(TVar5,TVar6);
    if ((bVar3 & 1) != 0) {
      this->callDepth = sVar1;
      while (sVar8 = std::vector<wasm::Name,_std::allocator<wasm::Name>_>::size
                               (&this->functionStack), sVar4 < sVar8) {
        std::vector<wasm::Name,_std::allocator<wasm::Name>_>::pop_back(&this->functionStack);
      }
      Literals::Literals(__return_storage_ptr__,(Literals *)local_e0);
      Flow::~Flow((Flow *)local_e0);
      FunctionScope::~FunctionScope((FunctionScope *)&flow.breakTo.super_IString.str._M_str);
      return __return_storage_ptr__;
    }
    poVar7 = std::operator<<((ostream *)&std::cerr,"calling ");
    name_00.super_IString.str._M_str = pcVar9;
    name_00.super_IString.str._M_len =
         (size_t)(function_00->super_Importable).super_Named.name.super_IString.str._M_str;
    poVar7 = wasm::operator<<((wasm *)poVar7,
                              (ostream *)
                              (function_00->super_Importable).super_Named.name.super_IString.str.
                              _M_len,name_00);
    poVar7 = std::operator<<(poVar7," resulted in ");
    poVar7 = (ostream *)::wasm::operator<<(poVar7,TVar5);
    poVar7 = std::operator<<(poVar7," but the function type is ");
    TVar5 = Function::getResults(function_00);
    poVar7 = (ostream *)::wasm::operator<<(poVar7,TVar5);
    std::operator<<(poVar7,'\n');
    ::wasm::handle_unreachable
              ("unexpected result type",
               "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-interpreter.h"
               ,0xf0b);
  }
  __assert_fail("!flow.breaking() || flow.breakTo == RETURN_FLOW",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-interpreter.h"
                ,0xf05,
                "Literals wasm::ModuleRunnerBase<(anonymous namespace)::EvallingModuleRunner>::callFunctionInternal(Name, const Literals &) [SubType = (anonymous namespace)::EvallingModuleRunner]"
               );
}

Assistant:

Literals callFunctionInternal(Name name, const Literals& arguments) {
    if (callDepth > maxDepth) {
      externalInterface->trap("stack limit");
    }
    auto previousCallDepth = callDepth;
    callDepth++;
    auto previousFunctionStackSize = functionStack.size();
    functionStack.push_back(name);

    Function* function = wasm.getFunction(name);
    assert(function);
    FunctionScope scope(function, arguments, *self());

#ifdef WASM_INTERPRETER_DEBUG
    std::cout << "entering " << function->name << "\n  with arguments:\n";
    for (unsigned i = 0; i < arguments.size(); ++i) {
      std::cout << "    $" << i << ": " << arguments[i] << '\n';
    }
#endif

    Flow flow = self()->visit(function->body);
    // cannot still be breaking, it means we missed our stop
    assert(!flow.breaking() || flow.breakTo == RETURN_FLOW);
    auto type = flow.getType();
    if (!Type::isSubType(type, function->getResults())) {
      std::cerr << "calling " << function->name << " resulted in " << type
                << " but the function type is " << function->getResults()
                << '\n';
      WASM_UNREACHABLE("unexpected result type");
    }
    // may decrease more than one, if we jumped up the stack
    callDepth = previousCallDepth;
    // if we jumped up the stack, we also need to pop higher frames
    // TODO can FunctionScope handle this automatically?
    while (functionStack.size() > previousFunctionStackSize) {
      functionStack.pop_back();
    }
#ifdef WASM_INTERPRETER_DEBUG
    std::cout << "exiting " << function->name << " with " << flow.values
              << '\n';
#endif
    return flow.values;
  }